

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O0

void __thiscall
HighsConflictPool::addReconvergenceCut
          (HighsConflictPool *this,HighsDomain *domain,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *reconvergenceFrontier,HighsDomainChange *reconvergenceDomchg)

{
  HighsBoundType HVar1;
  HighsDomainChange HVar2;
  bool bVar3;
  HighsVarType HVar4;
  size_type sVar5;
  reference ppVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar11;
  reference pLVar12;
  undefined8 in_RDX;
  HighsDomain *in_RSI;
  size_type sVar13;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar14;
  ConflictPoolPropagation *conflictProp;
  iterator __end1_1;
  iterator __begin1_1;
  vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
  *__range1_1;
  LocalDomChg *domchg;
  iterator __end1;
  iterator __begin1;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *__range1;
  double feastol;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgStack_;
  HighsInt i;
  pair<int,_int> freeslot;
  iterator it;
  HighsInt conflictLen;
  HighsInt end;
  HighsInt start;
  HighsInt conflictIndex;
  HighsDomain *in_stack_fffffffffffffeb8;
  HighsDomain *in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffec8;
  HighsDomain *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int iVar15;
  undefined4 in_stack_fffffffffffffee4;
  bool local_f1;
  __normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
  local_e0;
  long local_d8;
  reference local_d0;
  _Self local_c8;
  _Self local_c0;
  undefined8 local_b8;
  HighsDomain *local_b0;
  HighsDomainChange local_a8;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_98;
  int local_8c;
  _Base_ptr local_88;
  undefined1 local_80;
  int local_74;
  _Base_ptr local_70;
  _Base_ptr local_68;
  pair<int,_int> local_60;
  iterator in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _Rb_tree_const_iterator<std::pair<int,_int>_> local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 local_18;
  HighsDomain *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar5 = std::
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          ::size((set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                  *)0x588471);
  local_30 = (int)sVar5 + 1;
  std::_Rb_tree_const_iterator<std::pair<int,_int>_>::_Rb_tree_const_iterator(&local_38);
  bVar3 = std::
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::empty((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)0x58849a);
  local_f1 = true;
  if (!bVar3) {
    in_stack_ffffffffffffffb4 = 0xffffffff;
    std::make_pair<int&,int>((int *)in_stack_fffffffffffffeb8,(int *)0x5884db);
    local_38._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::lower_bound(in_stack_fffffffffffffec8._M_node,(key_type *)in_stack_fffffffffffffec0);
    in_stack_ffffffffffffffa8 =
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)in_stack_fffffffffffffeb8);
    local_f1 = std::operator==(&local_38,(_Self *)&stack0xffffffffffffffa8);
  }
  if (local_f1 == false) {
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x58859b);
    local_60 = *ppVar6;
    local_68 = local_38._M_node;
    local_70 = (_Base_ptr)
               std::
               set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
               ::erase_abi_cxx11_((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                                   *)in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
    local_28 = local_60.second;
    local_2c = local_60.second + local_30;
    if (local_30 < local_60.first) {
      local_74 = local_60.first - local_30;
      pVar14 = std::
               set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
               ::emplace<int,int&>((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                   in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
      local_88 = (_Base_ptr)pVar14.first._M_node;
      local_80 = pVar14.second;
    }
  }
  else {
    sVar13 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                       ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                        (in_RDI + 0x50));
    local_28 = (int)sVar13;
    local_2c = local_28 + local_30;
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::resize
              ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (size_type)in_stack_fffffffffffffed8);
  }
  bVar3 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0);
  if (bVar3) {
    sVar13 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (in_RDI + 0x68));
    local_24 = (int)sVar13;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8._M_node,
               (int *)in_stack_fffffffffffffec0);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(in_RDI + 0x68)
              );
    std::vector<short,_std::allocator<short>_>::resize
              ((vector<short,_std::allocator<short>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (size_type)in_stack_fffffffffffffed8);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(in_RDI + 0x68)
              );
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (size_type)in_stack_fffffffffffffed8);
  }
  else {
    pvVar7 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
    local_24 = *pvVar7;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x588719);
    iVar15 = local_28;
    pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (in_RDI + 0x68),(long)local_24);
    pvVar8->first = iVar15;
    iVar15 = local_2c;
    pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (in_RDI + 0x68),(long)local_24);
    pvVar8->second = iVar15;
  }
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),
                      (long)local_24);
  *pvVar9 = *pvVar9 + 1;
  pvVar10 = std::vector<short,_std::allocator<short>_>::operator[]
                      ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x20),(long)local_24);
  *pvVar10 = 0;
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 8);
  pvVar10 = std::vector<short,_std::allocator<short>_>::operator[]
                      ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x20),(long)local_24);
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar10);
  *pvVar7 = *pvVar7 + 1;
  local_8c = local_28;
  local_98 = HighsDomain::getDomainChangeStack(local_10);
  local_a8 = HighsDomain::flip(in_stack_fffffffffffffed0,
                               (HighsDomainChange *)in_stack_fffffffffffffec8._M_node);
  sVar13 = (size_type)local_8c;
  local_8c = local_8c + 1;
  pvVar11 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                      ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                       (in_RDI + 0x50),sVar13);
  HVar2 = local_a8;
  pvVar11->boundval = local_a8.boundval;
  pvVar11->column = local_a8.column;
  pvVar11->boundtype = local_a8.boundtype;
  local_a8 = HVar2;
  local_b0 = (HighsDomain *)HighsDomain::feastol((HighsDomain *)0x588868);
  local_b8 = local_18;
  local_c0._M_node =
       (_Base_ptr)
       std::
       set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
       ::begin((set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                *)in_stack_fffffffffffffeb8);
  local_c8._M_node =
       (_Base_ptr)
       std::
       set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
       ::end((set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              *)in_stack_fffffffffffffeb8);
  while (bVar3 = std::operator!=(&local_c0,&local_c8), bVar3) {
    pLVar12 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::operator*
                        ((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *)
                         in_stack_fffffffffffffec0);
    local_d0 = pLVar12;
    pvVar11 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                        ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                         (in_RDI + 0x50),(long)local_8c);
    pvVar11->boundval = (pLVar12->domchg).boundval;
    HVar1 = (pLVar12->domchg).boundtype;
    pvVar11->column = (pLVar12->domchg).column;
    pvVar11->boundtype = HVar1;
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
              ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)(in_RDI + 0x50),
               (long)local_8c);
    HVar4 = HighsDomain::variableType
                      (in_stack_fffffffffffffec0,
                       (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if (HVar4 == kContinuous) {
      pvVar11 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                          ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                           (in_RDI + 0x50),(long)local_8c);
      if (pvVar11->boundtype == kLower) {
        in_stack_fffffffffffffec0 = local_b0;
        pvVar11 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                             (in_RDI + 0x50),(long)local_8c);
        pvVar11->boundval = (double)in_stack_fffffffffffffec0 + pvVar11->boundval;
      }
      else {
        in_stack_fffffffffffffeb8 = local_b0;
        pvVar11 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                             (in_RDI + 0x50),(long)local_8c);
        pvVar11->boundval = pvVar11->boundval - (double)in_stack_fffffffffffffeb8;
      }
    }
    local_8c = local_8c + 1;
    std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::operator++
              ((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *)
               in_stack_fffffffffffffec0);
  }
  local_d8 = in_RDI + 200;
  local_e0._M_current =
       (ConflictPoolPropagation **)
       std::
       vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
       ::begin((vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
                *)in_stack_fffffffffffffeb8);
  std::
  vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
  ::end((vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
         *)in_stack_fffffffffffffeb8);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
                             *)in_stack_fffffffffffffeb8), bVar3) {
    __gnu_cxx::
    __normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
    ::operator*(&local_e0);
    HighsDomain::ConflictPoolPropagation::conflictAdded
              ((ConflictPoolPropagation *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (HighsInt)((ulong)in_stack_ffffffffffffffa8._M_node >> 0x20));
    __gnu_cxx::
    __normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
    ::operator++(&local_e0);
  }
  return;
}

Assistant:

void HighsConflictPool::addReconvergenceCut(
    const HighsDomain& domain,
    const std::set<HighsDomain::ConflictSet::LocalDomChg>&
        reconvergenceFrontier,
    const HighsDomainChange& reconvergenceDomchg) {
  HighsInt conflictIndex;
  HighsInt start;
  HighsInt end;
  HighsInt conflictLen = reconvergenceFrontier.size() + 1;
  std::set<std::pair<HighsInt, HighsInt>>::iterator it;
  if (freeSpaces_.empty() ||
      (it = freeSpaces_.lower_bound(
           std::make_pair(conflictLen, HighsInt{-1}))) == freeSpaces_.end()) {
    start = conflictEntries_.size();
    end = start + conflictLen;

    conflictEntries_.resize(end);
  } else {
    std::pair<HighsInt, HighsInt> freeslot = *it;
    freeSpaces_.erase(it);

    start = freeslot.second;
    end = start + conflictLen;
    // if the space was not completely occupied, we register the remainder of
    // it again in the priority queue
    if (freeslot.first > conflictLen) {
      freeSpaces_.emplace(freeslot.first - conflictLen, end);
    }
  }

  // register the range of entries for this conflict with a reused or a new
  // index
  if (deletedConflicts_.empty()) {
    conflictIndex = conflictRanges_.size();
    conflictRanges_.emplace_back(start, end);
    ages_.resize(conflictRanges_.size());
    modification_.resize(conflictRanges_.size());
  } else {
    conflictIndex = deletedConflicts_.back();
    deletedConflicts_.pop_back();
    conflictRanges_[conflictIndex].first = start;
    conflictRanges_[conflictIndex].second = end;
  }

  modification_[conflictIndex] += 1;
  ages_[conflictIndex] = 0;
  ageDistribution_[ages_[conflictIndex]] += 1;

  HighsInt i = start;
  const std::vector<HighsDomainChange>& domchgStack_ =
      domain.getDomainChangeStack();
  assert(i < end);
  conflictEntries_[i++] = domain.flip(reconvergenceDomchg);
  double feastol = domain.feastol();
  for (const HighsDomain::ConflictSet::LocalDomChg& domchg :
       reconvergenceFrontier) {
    assert(i < end);
    assert(domchg.pos >= 0);
    assert(domchg.pos < (HighsInt)domchgStack_.size());
    conflictEntries_[i] = domchg.domchg;
    if (domain.variableType(conflictEntries_[i].column) ==
        HighsVarType::kContinuous) {
      if (conflictEntries_[i].boundtype == HighsBoundType::kLower)
        conflictEntries_[i].boundval += feastol;
      else
        conflictEntries_[i].boundval -= feastol;
    }
    ++i;
  }

  for (HighsDomain::ConflictPoolPropagation* conflictProp : propagationDomains)
    conflictProp->conflictAdded(conflictIndex);
}